

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O1

void __thiscall
cfd::TransactionContext::AddInput(TransactionContext *this,UtxoData *utxo,uint32_t sequence)

{
  bool bVar1;
  CfdException *this_00;
  UtxoData dest;
  Utxo temp;
  UtxoData local_5f8;
  Utxo local_108;
  
  bVar1 = core::Txid::IsValid(&utxo->txid);
  if (bVar1) {
    UtxoData::UtxoData(&local_5f8);
    memset(&local_108,0,0xd8);
    UtxoUtil::ConvertToUtxo(utxo,&local_108,&local_5f8);
    core::Transaction::AddTxIn
              (&this->super_Transaction,&utxo->txid,utxo->vout,sequence,
               (Script *)core::Script::Empty);
    std::vector<cfd::UtxoData,std::allocator<cfd::UtxoData>>::emplace_back<cfd::UtxoData&>
              ((vector<cfd::UtxoData,std::allocator<cfd::UtxoData>> *)&this->utxo_map_,&local_5f8);
    UtxoData::~UtxoData(&local_5f8);
    return;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_5f8.block_height = (uint64_t)&local_5f8.block_hash.data_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5f8,"Failed to AddInput. invalid utxo txid.","");
  core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&local_5f8);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void TransactionContext::AddInput(const UtxoData& utxo, uint32_t sequence) {
  if (!utxo.txid.IsValid()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to AddInput. invalid utxo txid.");
  }

  UtxoData dest;
  Utxo temp;
  memset(&temp, 0, sizeof(temp));
  UtxoUtil::ConvertToUtxo(utxo, &temp, &dest);

  AddTxIn(utxo.txid, utxo.vout, sequence);
  utxo_map_.emplace_back(dest);
}